

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainerBase.cpp
# Opt level: O3

shared_ptr<gui::Widget> __thiscall gui::ContainerBase::getChild(ContainerBase *this,size_t index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  pointer psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<gui::Widget> sVar5;
  shared_ptr<gui::Widget> sVar6;
  shared_ptr<gui::Widget> sVar7;
  
  lVar2 = *(long *)(index + 8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long *)(index + 0x10) - lVar2 >> 4) <=
      in_RDX._M_pi) {
    this->_vptr_ContainerBase = (_func_int **)0x0;
    (this->children_).
    super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sVar6.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         in_RDX._M_pi;
    sVar6.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<gui::Widget>)
           sVar6.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>;
  }
  _Var4._M_pi = in_RDX._M_pi * 0x10;
  this->_vptr_ContainerBase = *(_func_int ***)((long)&(_Var4._M_pi)->_vptr__Sp_counted_base + lVar2)
  ;
  psVar3 = *(pointer *)((long)&(_Var4._M_pi)->_M_use_count + lVar2);
  (this->children_).
  super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>.
  _M_impl.super__Vector_impl_data._M_start = psVar3;
  if (psVar3 != (pointer)0x0) {
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1 = &(psVar3->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      sVar5.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar5.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<gui::Widget>)
             sVar5.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1 = &(psVar3->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
    *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    UNLOCK();
  }
  sVar7.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar7.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<gui::Widget>)sVar7.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Widget> ContainerBase::getChild(size_t index) const {
    if (index >= children_.size()) {
        return nullptr;
    }
    return children_[index];
}